

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O0

void anon_unknown.dwarf_7f4f::update_manifest(Manifest *manifest,Target *target,xml_node node)

{
  bool bVar1;
  xml_node *pxVar2;
  char_t *__lhs;
  xml_attribute local_d0;
  xml_node local_c8;
  xml_node rn_1;
  xml_named_node_iterator __end1_1;
  xml_named_node_iterator __begin1_1;
  xml_object_range<pugi::xml_named_node_iterator> *__range1_1;
  xml_node rn;
  xml_named_node_iterator __end1;
  xml_named_node_iterator __begin1;
  xml_object_range<pugi::xml_named_node_iterator> *__range1;
  Target *target_local;
  Manifest *manifest_local;
  xml_node node_local;
  
  manifest_local = (Manifest *)node._root;
  pugi::xml_node::children
            ((xml_object_range<pugi::xml_named_node_iterator> *)&__begin1._name,
             (xml_node *)&manifest_local,"require");
  join_0x00000010_0x00000000_ =
       pugi::xml_object_range<pugi::xml_named_node_iterator>::begin
                 ((xml_object_range<pugi::xml_named_node_iterator> *)&__begin1._name);
  _rn = pugi::xml_object_range<pugi::xml_named_node_iterator>::end
                  ((xml_object_range<pugi::xml_named_node_iterator> *)&__begin1._name);
  while (bVar1 = pugi::xml_named_node_iterator::operator!=
                           ((xml_named_node_iterator *)&__end1._name,(xml_named_node_iterator *)&rn)
        , bVar1) {
    pxVar2 = pugi::xml_named_node_iterator::operator*((xml_named_node_iterator *)&__end1._name);
    add_to_manifest(manifest,pxVar2->_root);
    pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)&__end1._name);
  }
  pugi::xml_node::children
            ((xml_object_range<pugi::xml_named_node_iterator> *)&__begin1_1._name,
             (xml_node *)&manifest_local,"remove");
  join_0x00000010_0x00000000_ =
       pugi::xml_object_range<pugi::xml_named_node_iterator>::begin
                 ((xml_object_range<pugi::xml_named_node_iterator> *)&__begin1_1._name);
  _rn_1 = pugi::xml_object_range<pugi::xml_named_node_iterator>::end
                    ((xml_object_range<pugi::xml_named_node_iterator> *)&__begin1_1._name);
  while (bVar1 = pugi::xml_named_node_iterator::operator!=
                           ((xml_named_node_iterator *)&__end1_1._name,
                            (xml_named_node_iterator *)&rn_1), bVar1) {
    pxVar2 = pugi::xml_named_node_iterator::operator*((xml_named_node_iterator *)&__end1_1._name);
    local_c8._root = pxVar2->_root;
    local_d0 = pugi::xml_node::attribute(&local_c8,"profile");
    __lhs = pugi::xml_attribute::value(&local_d0);
    bVar1 = std::operator==(__lhs,&(target->profile).super_string);
    if (bVar1) {
      remove_from_manifest(manifest,local_c8);
    }
    pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)&__end1_1._name);
  }
  return;
}

Assistant:

void update_manifest(Manifest& manifest,
                     const Target& target,
                     const pugi::xml_node node)
{
  for (const pugi::xml_node rn : node.children("require"))
    add_to_manifest(manifest, rn);

  // Apply <remove> tags for the selected profile
  for (const pugi::xml_node rn : node.children("remove"))
  {
    if (rn.attribute("profile").value() == target.profile)
      remove_from_manifest(manifest, rn);
  }
}